

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-memory.c
# Opt level: O3

int run_test_get_memory(void)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  uv_loop_t *puVar4;
  uv_loop_t *puVar5;
  size_t sVar6;
  undefined4 *puVar7;
  long extraout_RDX;
  addrinfo *ai;
  addrinfo *ai_00;
  long extraout_RDX_00;
  uv_getaddrinfo_t *req;
  uv_handle_t *handle;
  int *piVar8;
  long lVar9;
  uv_getaddrinfo_t uStack_260;
  uv_loop_t *puStack_1c0;
  uv_loop_t *puStack_1b8;
  uv_loop_t *puStack_1b0;
  uv_getaddrinfo_t uStack_1a8;
  uv_loop_t *puStack_108;
  code *pcStack_100;
  uv_getaddrinfo_t uStack_f8;
  uv_loop_t *puStack_58;
  undefined1 auStack_48 [56];
  
  auStack_48._40_8_ = (void *)0x158b59;
  puVar4 = (uv_loop_t *)uv_get_free_memory();
  auStack_48._40_8_ = (void *)0x158b61;
  puVar5 = (uv_loop_t *)uv_get_total_memory();
  auStack_48._40_8_ = (void *)0x158b69;
  uv_get_constrained_memory();
  auStack_48._40_8_ = (void *)0x158b80;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",puVar4,puVar5);
  if (puVar4 == (uv_loop_t *)0x0) {
    auStack_48._40_8_ = (void *)0x158b9e;
    run_test_get_memory_cold_3();
LAB_00158b9e:
    auStack_48._40_8_ = (void *)0x158ba3;
    run_test_get_memory_cold_2();
  }
  else {
    if (puVar5 == (uv_loop_t *)0x0) goto LAB_00158b9e;
    if (puVar4 < puVar5) {
      return 0;
    }
  }
  auStack_48._40_8_ = run_test_get_passwd;
  run_test_get_memory_cold_1();
  puStack_58 = (uv_loop_t *)0x158bb7;
  auStack_48._40_8_ = puVar4;
  iVar2 = uv_os_get_passwd((uv_passwd_t *)auStack_48);
  uVar1 = auStack_48._32_8_;
  if (iVar2 == 0) {
    if (*(char *)auStack_48._0_8_ == '\0') goto LAB_00158c7b;
    if (*(char *)auStack_48._24_8_ == '\0') goto LAB_00158c80;
    puStack_58 = (uv_loop_t *)0x158be8;
    sVar6 = strlen((char *)auStack_48._32_8_);
    puVar4 = (uv_loop_t *)uVar1;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)(uVar1 + (sVar6 - 1)) == '/') {
          puStack_58 = (uv_loop_t *)0x158c03;
          run_test_get_passwd_cold_13();
          goto LAB_00158c03;
        }
        goto LAB_00158c0c;
      }
      goto LAB_00158cb2;
    }
LAB_00158c03:
    if (*(char *)uVar1 == '/') {
LAB_00158c0c:
      if ((long)auStack_48._8_8_ < 0) goto LAB_00158c85;
      if ((long)auStack_48._16_8_ < 0) goto LAB_00158c8a;
      puVar4 = (uv_loop_t *)auStack_48;
      puStack_58 = (uv_loop_t *)0x158c29;
      uv_os_free_passwd((uv_passwd_t *)puVar4);
      if ((char *)auStack_48._0_8_ != (char *)0x0) goto LAB_00158c8f;
      if ((char *)auStack_48._24_8_ != (char *)0x0) goto LAB_00158c94;
      if ((uv_loop_t *)auStack_48._32_8_ != (uv_loop_t *)0x0) goto LAB_00158c99;
      puVar4 = (uv_loop_t *)auStack_48;
      puStack_58 = (uv_loop_t *)0x158c4c;
      uv_os_free_passwd((uv_passwd_t *)puVar4);
      if ((char *)auStack_48._0_8_ != (char *)0x0) goto LAB_00158c9e;
      if ((char *)auStack_48._24_8_ != (char *)0x0) goto LAB_00158ca3;
      if ((uv_loop_t *)auStack_48._32_8_ != (uv_loop_t *)0x0) goto LAB_00158ca8;
      puStack_58 = (uv_loop_t *)0x158c69;
      iVar2 = uv_os_get_passwd((uv_passwd_t *)0x0);
      if (iVar2 == -0x16) {
        return 0;
      }
      goto LAB_00158cad;
    }
  }
  else {
    puStack_58 = (uv_loop_t *)0x158c7b;
    run_test_get_passwd_cold_1();
LAB_00158c7b:
    puStack_58 = (uv_loop_t *)0x158c80;
    run_test_get_passwd_cold_15();
LAB_00158c80:
    puStack_58 = (uv_loop_t *)0x158c85;
    run_test_get_passwd_cold_14();
LAB_00158c85:
    puStack_58 = (uv_loop_t *)0x158c8a;
    run_test_get_passwd_cold_4();
LAB_00158c8a:
    puStack_58 = (uv_loop_t *)0x158c8f;
    run_test_get_passwd_cold_5();
LAB_00158c8f:
    puStack_58 = (uv_loop_t *)0x158c94;
    run_test_get_passwd_cold_6();
LAB_00158c94:
    puStack_58 = (uv_loop_t *)0x158c99;
    run_test_get_passwd_cold_7();
LAB_00158c99:
    puStack_58 = (uv_loop_t *)0x158c9e;
    run_test_get_passwd_cold_8();
LAB_00158c9e:
    puStack_58 = (uv_loop_t *)0x158ca3;
    run_test_get_passwd_cold_9();
LAB_00158ca3:
    puStack_58 = (uv_loop_t *)0x158ca8;
    run_test_get_passwd_cold_10();
LAB_00158ca8:
    puStack_58 = (uv_loop_t *)0x158cad;
    run_test_get_passwd_cold_11();
LAB_00158cad:
    puStack_58 = (uv_loop_t *)0x158cb2;
    run_test_get_passwd_cold_12();
LAB_00158cb2:
    puStack_58 = (uv_loop_t *)0x158cb7;
    run_test_get_passwd_cold_3();
  }
  puStack_58 = (uv_loop_t *)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar2 = (int)&uStack_f8;
  pcStack_100 = (code *)0x158cc9;
  puStack_58 = puVar4;
  puVar5 = uv_default_loop();
  pcStack_100 = (code *)0x158ce3;
  iVar3 = uv_getaddrinfo(puVar5,&uStack_f8,abort,(char *)0x0,(char *)0x0,(addrinfo *)0x0);
  if (iVar3 == -0x16) {
    pcStack_100 = (code *)0x158cf1;
    puVar5 = uv_default_loop();
    pcStack_100 = (code *)0x158d10;
    iVar2 = (int)&uStack_f8;
    iVar3 = uv_getaddrinfo(puVar5,&uStack_f8,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar3 != 0) goto LAB_00158d74;
    pcStack_100 = (code *)0x158d19;
    puVar5 = uv_default_loop();
    iVar2 = 0;
    pcStack_100 = (code *)0x158d23;
    iVar3 = uv_run(puVar5,UV_RUN_DEFAULT);
    if (iVar3 != 0) goto LAB_00158d79;
    if (fail_cb_called != 1) goto LAB_00158d7e;
    pcStack_100 = (code *)0x158d35;
    puVar4 = uv_default_loop();
    pcStack_100 = (code *)0x158d49;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    iVar2 = 0;
    pcStack_100 = (code *)0x158d53;
    uv_run(puVar4,UV_RUN_DEFAULT);
    pcStack_100 = (code *)0x158d58;
    puVar5 = uv_default_loop();
    pcStack_100 = (code *)0x158d60;
    iVar3 = uv_loop_close(puVar5);
    if (iVar3 == 0) {
      return 0;
    }
  }
  else {
    pcStack_100 = (code *)0x158d74;
    run_test_getaddrinfo_fail_cold_1();
LAB_00158d74:
    pcStack_100 = (code *)0x158d79;
    run_test_getaddrinfo_fail_cold_2();
LAB_00158d79:
    pcStack_100 = (code *)0x158d7e;
    run_test_getaddrinfo_fail_cold_3();
LAB_00158d7e:
    pcStack_100 = (code *)0x158d83;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_100 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar2) goto LAB_00158daf;
    if (extraout_RDX == 0) {
      puStack_108 = (uv_loop_t *)0x158da2;
      pcStack_100._0_4_ = extraout_EAX;
      uv_freeaddrinfo((addrinfo *)0x0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_100;
    }
  }
  else {
    puStack_108 = (uv_loop_t *)0x158daf;
    getaddrinfo_fail_cb_cold_1();
LAB_00158daf:
    puStack_108 = (uv_loop_t *)0x158db4;
    getaddrinfo_fail_cb_cold_2();
  }
  puStack_108 = (uv_loop_t *)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  puStack_1b0 = (uv_loop_t *)0x158dc6;
  puStack_108 = puVar4;
  puVar5 = uv_default_loop();
  puStack_1b0 = (uv_loop_t *)0x158de0;
  iVar2 = uv_getaddrinfo(puVar5,&uStack_1a8,(uv_getaddrinfo_cb)0x0,"xyzzy.xyzzy.xyzzy.",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 < 0) {
    puStack_1b0 = (uv_loop_t *)0x158df1;
    uv_freeaddrinfo(uStack_1a8.addrinfo);
    puStack_1b0 = (uv_loop_t *)0x158df6;
    puVar4 = uv_default_loop();
    puStack_1b0 = (uv_loop_t *)0x158e0a;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_1b0 = (uv_loop_t *)0x158e14;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_1b0 = (uv_loop_t *)0x158e19;
    puVar5 = uv_default_loop();
    puStack_1b0 = (uv_loop_t *)0x158e21;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_1b0 = (uv_loop_t *)0x158e35;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  puStack_1b0 = (uv_loop_t *)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  puStack_1b8 = (uv_loop_t *)0x158e45;
  puStack_1b0 = puVar4;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  puStack_1b8 = (uv_loop_t *)0x158e51;
  puVar5 = uv_default_loop();
  puStack_1b8 = (uv_loop_t *)0x158e74;
  iVar2 = uv_getaddrinfo(puVar5,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    puStack_1b8 = (uv_loop_t *)0x158e7d;
    puVar5 = uv_default_loop();
    puStack_1b8 = (uv_loop_t *)0x158e87;
    uv_run(puVar5,UV_RUN_DEFAULT);
    if (getaddrinfo_cbs != 1) goto LAB_00158ecd;
    puStack_1b8 = (uv_loop_t *)0x158e95;
    puVar4 = uv_default_loop();
    puStack_1b8 = (uv_loop_t *)0x158ea9;
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    puStack_1b8 = (uv_loop_t *)0x158eb3;
    uv_run(puVar4,UV_RUN_DEFAULT);
    puStack_1b8 = (uv_loop_t *)0x158eb8;
    puVar5 = uv_default_loop();
    puStack_1b8 = (uv_loop_t *)0x158ec0;
    iVar2 = uv_loop_close(puVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    puStack_1b8 = (uv_loop_t *)0x158ecd;
    run_test_getaddrinfo_basic_cold_1();
LAB_00158ecd:
    puStack_1b8 = (uv_loop_t *)0x158ed2;
    run_test_getaddrinfo_basic_cold_2();
  }
  puStack_1b8 = (uv_loop_t *)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  puStack_1b8 = puVar4;
  if ((uv_loop_t *)getaddrinfo_handle == puVar5) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    puStack_1c0 = (uv_loop_t *)0x158eef;
    free(puVar5);
    uv_freeaddrinfo(ai);
    return extraout_EAX_00;
  }
  puStack_1c0 = (uv_loop_t *)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  puStack_1c0 = puVar4;
  puVar4 = uv_default_loop();
  iVar2 = uv_getaddrinfo(puVar4,&uStack_260,(uv_getaddrinfo_cb)0x0,"localhost",(char *)0x0,
                         (addrinfo *)0x0);
  if (iVar2 == 0) {
    uv_freeaddrinfo(uStack_260.addrinfo);
    puVar4 = uv_default_loop();
    uv_walk(puVar4,close_walk_cb,(void *)0x0);
    uv_run(puVar4,UV_RUN_DEFAULT);
    puVar4 = uv_default_loop();
    iVar2 = uv_loop_close(puVar4);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  req = getaddrinfo_handles;
  piVar8 = callback_counts;
  lVar9 = 0;
  do {
    *piVar8 = 0;
    puVar4 = (uv_loop_t *)0x4;
    puVar7 = (undefined4 *)malloc(4);
    if (puVar7 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015906c:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_00159071;
    }
    *puVar7 = (int)lVar9;
    req->data = puVar7;
    puVar4 = uv_default_loop();
    iVar2 = uv_getaddrinfo(puVar4,req,getaddrinfo_cuncurrent_cb,"localhost",(char *)0x0,
                           (addrinfo *)0x0);
    if (iVar2 != 0) goto LAB_0015906c;
    lVar9 = lVar9 + 1;
    req = req + 1;
    piVar8 = piVar8 + 1;
  } while (lVar9 != 10);
  puVar4 = uv_default_loop();
  lVar9 = 0;
  uv_run(puVar4,UV_RUN_DEFAULT);
  do {
    if (*(int *)((long)callback_counts + lVar9) != 1) goto LAB_00159071;
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x28);
  puVar4 = uv_default_loop();
  uv_walk(puVar4,close_walk_cb,(void *)0x0);
  uv_run(puVar4,UV_RUN_DEFAULT);
  puVar4 = uv_default_loop();
  iVar2 = uv_loop_close(puVar4);
  if (iVar2 == 0) {
    return 0;
  }
LAB_00159076:
  run_test_getaddrinfo_concurrent_cold_3();
  handle = (uv_handle_t *)puVar4->data;
  piVar8 = callback_counts;
  puVar5 = (uv_loop_t *)&closedir_req.bufsml[1].len;
  lVar9 = 0;
  do {
    puVar5 = (uv_loop_t *)((puVar5->wq_mutex).__size + 0x18);
    if (puVar5 == puVar4) goto LAB_001590b3;
    piVar8 = piVar8 + 1;
    lVar9 = lVar9 + 1;
  } while (lVar9 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar9 = extraout_RDX_00;
LAB_001590b3:
  if (*(int *)&handle->data == (int)lVar9) {
    *piVar8 = *piVar8 + 1;
    free(handle);
    uv_freeaddrinfo(ai_00);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return extraout_EAX_01;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar2 = uv_is_closing(handle);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close(handle,(uv_close_cb)0x0);
  return extraout_EAX_02;
LAB_00159071:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_00159076;
}

Assistant:

TEST_IMPL(get_memory) {
  uint64_t free_mem = uv_get_free_memory();
  uint64_t total_mem = uv_get_total_memory();
  uint64_t constrained_mem = uv_get_constrained_memory();

  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",
         (unsigned long long) free_mem,
         (unsigned long long) total_mem,
         (unsigned long long) constrained_mem);

  /* On IBMi PASE, the amount of memory in use includes storage used for
   * memory and disks so it is possible to exceed the amount of main storage.
   */
#ifndef __PASE__
  ASSERT(free_mem > 0);
#endif
  ASSERT(total_mem > 0);
  ASSERT(total_mem > free_mem);

  return 0;
}